

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i18n.hpp
# Opt level: O3

string * __thiscall
I18N::Format<std::__cxx11::string&>
          (string *__return_storage_ptr__,I18N *this,string *id,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  initializer_list<util::variant> __l;
  vector<util::variant,_std::allocator<util::variant>_> v;
  allocator_type local_71;
  vector<util::variant,_std::allocator<util::variant>_> local_70;
  variant local_58;
  
  util::variant::variant(&local_58,args);
  __l._M_len = 1;
  __l._M_array = &local_58;
  std::vector<util::variant,_std::allocator<util::variant>_>::vector(&local_70,__l,&local_71);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.val_string._M_dataplus._M_p != &local_58.val_string.field_2) {
    operator_delete(local_58.val_string._M_dataplus._M_p,
                    local_58.val_string.field_2._M_allocated_capacity + 1);
  }
  FormatV(__return_storage_ptr__,this,id,&local_70);
  std::vector<util::variant,_std::allocator<util::variant>_>::~vector(&local_70);
  return __return_storage_ptr__;
}

Assistant:

std::string Format(const std::string& id, Args&&... args) const
		{
			std::vector<util::variant> v{args...};
			return FormatV(id, std::move(v));
		}